

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.h
# Opt level: O3

QRect __thiscall QRectF::toRect(QRectF *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  QRect QVar8;
  
  dVar5 = this->xp;
  dVar4 = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
  bVar1 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  dVar6 = (double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
  QVar8.x1.m_i = (int)dVar6;
  dVar4 = this->yp;
  dVar7 = (double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4;
  bVar1 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  dVar7 = (double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar7);
  iVar3 = (int)dVar7;
  dVar5 = (dVar5 - (double)(int)dVar6) * 0.5 + this->w;
  dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
  bVar1 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  dVar4 = (dVar4 - (double)(int)dVar7) * 0.5 + this->h;
  dVar4 = (double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4;
  bVar2 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  QVar8.x2.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5) +
                 QVar8.x1.m_i + -1;
  QVar8.y1.m_i = iVar3;
  QVar8.y2.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar4) +
                 iVar3 + -1;
  return QVar8;
}

Assistant:

constexpr inline QRect QRectF::toRect() const noexcept
{
    // This rounding is designed to minimize the maximum possible difference
    // in topLeft(), bottomRight(), and size() after rounding.
    // All dimensions are at most off by 0.75, and topLeft by at most 0.5.
    const int nxp = QtPrivate::qSaturateRound(xp);
    const int nyp = QtPrivate::qSaturateRound(yp);
    const int nw = QtPrivate::qSaturateRound(w + (xp - nxp) / 2);
    const int nh = QtPrivate::qSaturateRound(h + (yp - nyp) / 2);
    return QRect(nxp, nyp, nw, nh);
}